

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O0

ExprBase * Evaluate(ExpressionEvalContext *ctx,ExprBase *expression)

{
  bool bVar1;
  ExpressionEvalContext *local_28;
  ExprBase *result;
  ExprBase *expression_local;
  ExpressionEvalContext *ctx_local;
  
  bVar1 = isType<TypeError>(expression->type);
  if (bVar1) {
    ctx_local = (ExpressionEvalContext *)0x0;
  }
  else {
    ctx->expressionDepth = ctx->expressionDepth + 1;
    if (ctx->expressionDepthLimit < ctx->expressionDepth) {
      ctx_local = (ExpressionEvalContext *)Report(ctx,"ERROR: expression depth limit reached");
    }
    else {
      switch(expression->typeID) {
      case 0:
        local_28 = (ExpressionEvalContext *)Report(ctx,"ERROR: invalid expression");
        break;
      case 1:
        local_28 = (ExpressionEvalContext *)Report(ctx,"ERROR: invalid expression");
        break;
      case 2:
        local_28 = (ExpressionEvalContext *)EvaluateVoid(ctx,expression);
        break;
      case 3:
        local_28 = (ExpressionEvalContext *)EvaluateBoolLiteral(ctx,(ExprBoolLiteral *)expression);
        break;
      case 4:
        local_28 = (ExpressionEvalContext *)
                   EvaluateCharacterLiteral(ctx,(ExprCharacterLiteral *)expression);
        break;
      case 5:
        local_28 = (ExpressionEvalContext *)
                   EvaluateStringLiteral(ctx,(ExprStringLiteral *)expression);
        break;
      case 6:
        local_28 = (ExpressionEvalContext *)
                   EvaluateIntegerLiteral(ctx,(ExprIntegerLiteral *)expression);
        break;
      case 7:
        local_28 = (ExpressionEvalContext *)
                   EvaluateRationalLiteral(ctx,(ExprRationalLiteral *)expression);
        break;
      case 8:
        local_28 = (ExpressionEvalContext *)EvaluateTypeLiteral(ctx,(ExprTypeLiteral *)expression);
        break;
      case 9:
        local_28 = (ExpressionEvalContext *)
                   EvaluateNullptrLiteral(ctx,(ExprNullptrLiteral *)expression);
        break;
      case 10:
        local_28 = (ExpressionEvalContext *)
                   EvaluateFunctionIndexLiteral(ctx,(ExprFunctionIndexLiteral *)expression);
        break;
      default:
        __assert_fail("!\"unknown type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0xd11,"ExprBase *Evaluate(ExpressionEvalContext &, ExprBase *)");
      case 0xe:
        local_28 = (ExpressionEvalContext *)Evaluate(ctx,(ExprBase *)expression[1]._vptr_ExprBase);
        break;
      case 0xf:
        local_28 = (ExpressionEvalContext *)EvaluateArray(ctx,(ExprArray *)expression);
        break;
      case 0x10:
        local_28 = (ExpressionEvalContext *)EvaluatePreModify(ctx,(ExprPreModify *)expression);
        break;
      case 0x11:
        local_28 = (ExpressionEvalContext *)EvaluatePostModify(ctx,(ExprPostModify *)expression);
        break;
      case 0x12:
        local_28 = (ExpressionEvalContext *)EvaluateCast(ctx,(ExprTypeCast *)expression);
        break;
      case 0x13:
        local_28 = (ExpressionEvalContext *)EvaluateUnaryOp(ctx,(ExprUnaryOp *)expression);
        break;
      case 0x14:
        local_28 = (ExpressionEvalContext *)EvaluateBinaryOp(ctx,(ExprBinaryOp *)expression);
        break;
      case 0x15:
        local_28 = (ExpressionEvalContext *)EvaluateGetAddress(ctx,(ExprGetAddress *)expression);
        break;
      case 0x16:
        local_28 = (ExpressionEvalContext *)EvaluateDereference(ctx,(ExprDereference *)expression);
        break;
      case 0x17:
        local_28 = (ExpressionEvalContext *)Evaluate(ctx,(ExprBase *)expression[1]._vptr_ExprBase);
        break;
      case 0x18:
        local_28 = (ExpressionEvalContext *)EvaluateConditional(ctx,(ExprConditional *)expression);
        break;
      case 0x19:
        local_28 = (ExpressionEvalContext *)EvaluateAssignment(ctx,(ExprAssignment *)expression);
        break;
      case 0x1a:
        local_28 = (ExpressionEvalContext *)EvaluateMemberAccess(ctx,(ExprMemberAccess *)expression)
        ;
        break;
      case 0x1b:
        local_28 = (ExpressionEvalContext *)EvaluateArrayIndex(ctx,(ExprArrayIndex *)expression);
        break;
      case 0x1c:
        local_28 = (ExpressionEvalContext *)EvaluateReturn(ctx,(ExprReturn *)expression);
        break;
      case 0x1d:
        local_28 = (ExpressionEvalContext *)EvaluateYield(ctx,(ExprYield *)expression);
        break;
      case 0x1e:
        local_28 = (ExpressionEvalContext *)
                   EvaluateVariableDefinition(ctx,(ExprVariableDefinition *)expression);
        break;
      case 0x1f:
        local_28 = (ExpressionEvalContext *)
                   EvaluateZeroInitialize(ctx,(ExprZeroInitialize *)expression);
        break;
      case 0x20:
        local_28 = (ExpressionEvalContext *)EvaluateArraySetup(ctx,(ExprArraySetup *)expression);
        break;
      case 0x21:
        local_28 = (ExpressionEvalContext *)
                   EvaluateVariableDefinitions(ctx,(ExprVariableDefinitions *)expression);
        break;
      case 0x22:
        local_28 = (ExpressionEvalContext *)
                   EvaluateVariableAccess(ctx,(ExprVariableAccess *)expression);
        break;
      case 0x23:
        local_28 = (ExpressionEvalContext *)
                   EvaluateFunctionContextAccess(ctx,(ExprFunctionContextAccess *)expression);
        break;
      case 0x24:
        local_28 = (ExpressionEvalContext *)
                   EvaluateFunctionDefinition(ctx,(ExprFunctionDefinition *)expression);
        break;
      case 0x25:
        local_28 = (ExpressionEvalContext *)
                   EvaluateGenericFunctionPrototype(ctx,(ExprGenericFunctionPrototype *)expression);
        break;
      case 0x26:
        local_28 = (ExpressionEvalContext *)
                   EvaluateFunctionAccess(ctx,(ExprFunctionAccess *)expression);
        break;
      case 0x27:
        local_28 = (ExpressionEvalContext *)0x0;
        break;
      case 0x28:
        local_28 = (ExpressionEvalContext *)0x0;
        break;
      case 0x29:
        local_28 = (ExpressionEvalContext *)EvaluateFunctionCall(ctx,(ExprFunctionCall *)expression)
        ;
        break;
      case 0x2a:
        local_28 = (ExpressionEvalContext *)EvaluateVoid(ctx,expression);
        break;
      case 0x2b:
        local_28 = (ExpressionEvalContext *)EvaluateVoid(ctx,expression);
        break;
      case 0x2c:
        local_28 = (ExpressionEvalContext *)EvaluateVoid(ctx,expression);
        break;
      case 0x2d:
        local_28 = (ExpressionEvalContext *)EvaluateVoid(ctx,expression);
        break;
      case 0x2e:
        local_28 = (ExpressionEvalContext *)EvaluateVoid(ctx,expression);
        break;
      case 0x2f:
        local_28 = (ExpressionEvalContext *)EvaluateIfElse(ctx,(ExprIfElse *)expression);
        break;
      case 0x30:
        local_28 = (ExpressionEvalContext *)EvaluateFor(ctx,(ExprFor *)expression);
        break;
      case 0x31:
        local_28 = (ExpressionEvalContext *)EvaluateWhile(ctx,(ExprWhile *)expression);
        break;
      case 0x32:
        local_28 = (ExpressionEvalContext *)EvaluateDoWhile(ctx,(ExprDoWhile *)expression);
        break;
      case 0x33:
        local_28 = (ExpressionEvalContext *)EvaluateSwitch(ctx,(ExprSwitch *)expression);
        break;
      case 0x34:
        local_28 = (ExpressionEvalContext *)EvaluateBreak(ctx,(ExprBreak *)expression);
        break;
      case 0x35:
        local_28 = (ExpressionEvalContext *)EvaluateContinue(ctx,(ExprContinue *)expression);
        break;
      case 0x36:
        local_28 = (ExpressionEvalContext *)EvaluateBlock(ctx,(ExprBlock *)expression);
        break;
      case 0x37:
        local_28 = (ExpressionEvalContext *)EvaluateSequence(ctx,(ExprSequence *)expression);
        break;
      case 0x38:
        local_28 = (ExpressionEvalContext *)EvaluateModule(ctx,(ExprModule *)expression);
      }
      ctx->expressionDepth = ctx->expressionDepth - 1;
      ctx_local = local_28;
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* Evaluate(ExpressionEvalContext &ctx, ExprBase *expression)
{
	if(isType<TypeError>(expression->type))
		return NULL;

	ctx.expressionDepth++;

	if(ctx.expressionDepth > ctx.expressionDepthLimit)
		return Report(ctx, "ERROR: expression depth limit reached");

	ExprBase *result = NULL;

	switch(expression->typeID)
	{
	case ExprError::myTypeID:
		result = Report(ctx, "ERROR: invalid expression");
		break;
	case ExprErrorTypeMemberAccess::myTypeID:
		result = Report(ctx, "ERROR: invalid expression");
		break;
	case ExprVoid::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprBoolLiteral::myTypeID:
		result = EvaluateBoolLiteral(ctx, (ExprBoolLiteral*)expression);
		break;
	case ExprCharacterLiteral::myTypeID:
		result = EvaluateCharacterLiteral(ctx, (ExprCharacterLiteral*)expression);
		break;
	case ExprStringLiteral::myTypeID:
		result = EvaluateStringLiteral(ctx, (ExprStringLiteral*)expression);
		break;
	case ExprIntegerLiteral::myTypeID:
		result = EvaluateIntegerLiteral(ctx, (ExprIntegerLiteral*)expression);
		break;
	case ExprRationalLiteral::myTypeID:
		result = EvaluateRationalLiteral(ctx, (ExprRationalLiteral*)expression);
		break;
	case ExprTypeLiteral::myTypeID:
		result = EvaluateTypeLiteral(ctx, (ExprTypeLiteral*)expression);
		break;
	case ExprNullptrLiteral::myTypeID:
		result = EvaluateNullptrLiteral(ctx, (ExprNullptrLiteral*)expression);
		break;
	case ExprFunctionIndexLiteral::myTypeID:
		result = EvaluateFunctionIndexLiteral(ctx, (ExprFunctionIndexLiteral*)expression);
		break;
	case ExprPassthrough::myTypeID:
		result = Evaluate(ctx, ((ExprPassthrough*)expression)->value);
		break;
	case ExprArray::myTypeID:
		result = EvaluateArray(ctx, (ExprArray*)expression);
		break;
	case ExprPreModify::myTypeID:
		result = EvaluatePreModify(ctx, (ExprPreModify*)expression);
		break;
	case ExprPostModify::myTypeID:
		result = EvaluatePostModify(ctx, (ExprPostModify*)expression);
		break;
	case ExprTypeCast::myTypeID:
		result = EvaluateCast(ctx, (ExprTypeCast*)expression);
		break;
	case ExprUnaryOp::myTypeID:
		result = EvaluateUnaryOp(ctx, (ExprUnaryOp*)expression);
		break;
	case ExprBinaryOp::myTypeID:
		result = EvaluateBinaryOp(ctx, (ExprBinaryOp*)expression);
		break;
	case ExprGetAddress::myTypeID:
		result = EvaluateGetAddress(ctx, (ExprGetAddress*)expression);
		break;
	case ExprDereference::myTypeID:
		result = EvaluateDereference(ctx, (ExprDereference*)expression);
		break;
	case ExprUnboxing::myTypeID:
		result = Evaluate(ctx, ((ExprUnboxing*)expression)->value);
		break;
	case ExprConditional::myTypeID:
		result = EvaluateConditional(ctx, (ExprConditional*)expression);
		break;
	case ExprAssignment::myTypeID:
		result = EvaluateAssignment(ctx, (ExprAssignment*)expression);
		break;
	case ExprMemberAccess::myTypeID:
		result = EvaluateMemberAccess(ctx, (ExprMemberAccess*)expression);
		break;
	case ExprArrayIndex::myTypeID:
		result = EvaluateArrayIndex(ctx, (ExprArrayIndex*)expression);
		break;
	case ExprReturn::myTypeID:
		result = EvaluateReturn(ctx, (ExprReturn*)expression);
		break;
	case ExprYield::myTypeID:
		result = EvaluateYield(ctx, (ExprYield*)expression);
		break;
	case ExprVariableDefinition::myTypeID:
		result = EvaluateVariableDefinition(ctx, (ExprVariableDefinition*)expression);
		break;
	case ExprZeroInitialize::myTypeID:
		result = EvaluateZeroInitialize(ctx, (ExprZeroInitialize*)expression);
		break;
	case ExprArraySetup::myTypeID:
		result = EvaluateArraySetup(ctx, (ExprArraySetup*)expression);
		break;
	case ExprVariableDefinitions::myTypeID:
		result = EvaluateVariableDefinitions(ctx, (ExprVariableDefinitions*)expression);
		break;
	case ExprVariableAccess::myTypeID:
		result = EvaluateVariableAccess(ctx, (ExprVariableAccess*)expression);
		break;
	case ExprFunctionContextAccess::myTypeID:
		result = EvaluateFunctionContextAccess(ctx, (ExprFunctionContextAccess*)expression);
		break;
	case ExprFunctionDefinition::myTypeID:
		result = EvaluateFunctionDefinition(ctx, (ExprFunctionDefinition*)expression);
		break;
	case ExprGenericFunctionPrototype::myTypeID:
		result = EvaluateGenericFunctionPrototype(ctx, (ExprGenericFunctionPrototype*)expression);
		break;
	case ExprFunctionAccess::myTypeID:
		result = EvaluateFunctionAccess(ctx, (ExprFunctionAccess*)expression);
		break;
	case ExprFunctionOverloadSet::myTypeID:
		result = NULL;
		break;
	case ExprShortFunctionOverloadSet::myTypeID:
		result = NULL;
		break;
	case ExprFunctionCall::myTypeID:
		result = EvaluateFunctionCall(ctx, (ExprFunctionCall*)expression);
		break;
	case ExprAliasDefinition::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprClassPrototype::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprGenericClassPrototype::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprClassDefinition::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprEnumDefinition::myTypeID:
		result = EvaluateVoid(ctx, expression);
		break;
	case ExprIfElse::myTypeID:
		result = EvaluateIfElse(ctx, (ExprIfElse*)expression);
		break;
	case ExprFor::myTypeID:
		result = EvaluateFor(ctx, (ExprFor*)expression);
		break;
	case ExprWhile::myTypeID:
		result = EvaluateWhile(ctx, (ExprWhile*)expression);
		break;
	case ExprDoWhile::myTypeID:
		result = EvaluateDoWhile(ctx, (ExprDoWhile*)expression);
		break;
	case ExprSwitch::myTypeID:
		result = EvaluateSwitch(ctx, (ExprSwitch*)expression);
		break;
	case ExprBreak::myTypeID:
		result = EvaluateBreak(ctx, (ExprBreak*)expression);
		break;
	case ExprContinue::myTypeID:
		result = EvaluateContinue(ctx, (ExprContinue*)expression);
		break;
	case ExprBlock::myTypeID:
		result = EvaluateBlock(ctx, (ExprBlock*)expression);
		break;
	case ExprSequence::myTypeID:
		result = EvaluateSequence(ctx, (ExprSequence*)expression);
		break;
	case ExprModule::myTypeID:
		result = EvaluateModule(ctx, (ExprModule*)expression);
		break;
	default:
		assert(!"unknown type");
		break;
	}

	ctx.expressionDepth--;

	return result;
}